

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

unique_ptr<Catch::Detail::EnumInfo>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  int *piVar1;
  EnumInfo *pEVar2;
  EnumInfo *this;
  long *in_R9;
  long lVar3;
  const_iterator __begin2;
  int *piVar4;
  StringRef enums;
  int value;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  int local_4c;
  _Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_48;
  
  this = (EnumInfo *)enumName.m_start;
  make_unique<Catch::Detail::EnumInfo>();
  pEVar2 = unique_ptr<Catch::Detail::EnumInfo>::operator->
                     ((unique_ptr<Catch::Detail::EnumInfo> *)this);
  (pEVar2->m_name).m_start = (char *)enumName.m_size;
  (pEVar2->m_name).m_size = (size_type)allValueNames.m_start;
  pEVar2 = unique_ptr<Catch::Detail::EnumInfo>::operator->
                     ((unique_ptr<Catch::Detail::EnumInfo> *)this);
  std::vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
  ::reserve(&pEVar2->m_values,in_R9[1] - *in_R9 >> 2);
  enums.m_size = (size_type)values;
  enums.m_start = (char *)allValueNames.m_size;
  parseEnums((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)&local_48,enums);
  piVar4 = (int *)*in_R9;
  piVar1 = (int *)in_R9[1];
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 4 ==
      (long)piVar1 - (long)piVar4 >> 2) {
    lVar3 = 0;
    for (; piVar4 != piVar1; piVar4 = piVar4 + 1) {
      local_4c = *piVar4;
      pEVar2 = unique_ptr<Catch::Detail::EnumInfo>::operator->
                         ((unique_ptr<Catch::Detail::EnumInfo> *)this);
      std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
      emplace_back<int&,Catch::StringRef_const&>
                ((vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>
                  *)&pEVar2->m_values,&local_4c,
                 (StringRef *)
                 ((long)&(local_48._M_impl.super__Vector_impl_data._M_start)->m_start + lVar3));
      lVar3 = lVar3 + 0x10;
    }
    std::_Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~_Vector_base(&local_48)
    ;
    return (unique_ptr<Catch::Detail::EnumInfo>)this;
  }
  __assert_fail("valueNames.size() == values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0xe91,
                "Catch::Detail::unique_ptr<EnumInfo> Catch::Detail::makeEnumInfo(StringRef, StringRef, const std::vector<int> &)"
               );
}

Assistant:

Catch::Detail::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            auto enumInfo = Catch::Detail::make_unique<EnumInfo>();
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }